

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O2

CloudNode * Kit_TruthToCloud_rec(CloudManager *dd,uint *pTruth,int nVars,int nVarsAll)

{
  long lVar1;
  long lVar2;
  CloudNode *pCVar3;
  CloudNode *t;
  ulong uVar4;
  int nVars_00;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  nVars_00 = 5;
  if (nVars < 5) {
    nVars_00 = nVars;
  }
  do {
    iVar7 = nVars;
    if (iVar7 < 6) {
      pCVar3 = Kit_TruthToCloud5_rec(dd,*pTruth,nVars_00,nVarsAll);
      return pCVar3;
    }
    uVar6 = (ulong)(uint)(1 << ((char)iVar7 - 5U & 0x1f));
    uVar4 = uVar6;
    do {
      if ((int)uVar4 < 1) {
        return dd->zero;
      }
      lVar1 = uVar4 - 1;
      uVar4 = uVar4 - 1;
    } while (pTruth[lVar1] == 0);
    do {
      if ((int)uVar6 < 1) {
        return dd->one;
      }
      lVar1 = uVar6 - 1;
      uVar6 = uVar6 - 1;
    } while (pTruth[lVar1] == 0xffffffff);
    nVars = iVar7 + -1;
    uVar5 = 1 << ((char)iVar7 - 6U & 0x1f);
    uVar6 = (ulong)uVar5;
    uVar4 = uVar6;
    while (0 < (int)uVar4) {
      lVar1 = uVar4 - 1;
      lVar2 = uVar4 - 1;
      uVar4 = uVar4 - 1;
      if (pTruth[lVar1] != pTruth[(int)uVar5 + lVar2]) {
        goto LAB_004c5d94;
      }
    }
  } while( true );
  while (lVar1 = uVar6 - 1, lVar2 = uVar6 - 1, uVar6 = uVar6 - 1,
        (pTruth[(int)uVar5 + lVar1] ^ pTruth[lVar2]) == 0xffffffff) {
LAB_004c5d94:
    if ((int)uVar6 < 1) {
      pCVar3 = Kit_TruthToCloud_rec(dd,pTruth,nVars,nVarsAll);
      t = (CloudNode *)((ulong)pCVar3 ^ 1);
      goto LAB_004c5de3;
    }
  }
  pCVar3 = Kit_TruthToCloud_rec(dd,pTruth,nVars,nVarsAll);
  t = Kit_TruthToCloud_rec(dd,pTruth + (int)uVar5,nVars,nVarsAll);
LAB_004c5de3:
  pCVar3 = Cloud_MakeNode(dd,nVarsAll - iVar7,t,pCVar3);
  return pCVar3;
}

Assistant:

CloudNode * Kit_TruthToCloud_rec( CloudManager * dd, unsigned * pTruth, int nVars, int nVarsAll )
{
    CloudNode * pCof0, * pCof1;
    unsigned * pTruth0, * pTruth1;
    if ( nVars <= 5 )
        return Kit_TruthToCloud5_rec( dd, pTruth[0], nVars, nVarsAll );
    if ( Kit_TruthIsConst0(pTruth, nVars) )
        return dd->zero;
    if ( Kit_TruthIsConst1(pTruth, nVars) )
        return dd->one;
//    Count++;
    pTruth0 = pTruth;
    pTruth1 = pTruth + Kit_TruthWordNum(nVars-1);
    if ( Kit_TruthIsEqual( pTruth0, pTruth1, nVars - 1 ) )
        return Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
    if ( Kit_TruthIsOpposite( pTruth0, pTruth1, nVars - 1 ) )
    {
        pCof0 = Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
        pCof1 = Cloud_Not( pCof0 );
    }
    else
    {
        pCof0 = Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
        pCof1 = Kit_TruthToCloud_rec( dd, pTruth1, nVars - 1, nVarsAll );
    }
    return Cloud_MakeNode( dd, nVarsAll - nVars, pCof1, pCof0 );
}